

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O3

void __thiscall CDirectiveAlignFill::Encode(CDirectiveAlignFill *this)

{
  bool bVar1;
  size_t in_RCX;
  void *pvVar2;
  void *__buf;
  uchar buffer [128];
  undefined1 auStack_98 [128];
  
  __buf = (void *)this->finalSize;
  pvVar2 = (void *)0x80;
  if ((long)__buf < 0x80) {
    pvVar2 = __buf;
  }
  memset(auStack_98,*(int *)&this->fillByte,(size_t)pvVar2);
  pvVar2 = __buf;
  if (0x80 < (long)__buf) {
    do {
      FileManager::write(g_fileManager,(int)auStack_98,(void *)0x80,in_RCX);
      __buf = (void *)((long)pvVar2 + -0x80);
      bVar1 = (void *)0x100 < pvVar2;
      pvVar2 = __buf;
    } while (bVar1);
  }
  FileManager::write(g_fileManager,(int)auStack_98,__buf,in_RCX);
  return;
}

Assistant:

void CDirectiveAlignFill::Encode() const
{
	unsigned char buffer[128];
	int64_t n = finalSize;

	memset(buffer,fillByte,n > 128 ? 128 : n);
	while (n > 128)
	{
		g_fileManager->write(buffer,128);
		n -= 128;
	}

	g_fileManager->write(buffer,n);
}